

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TypeParameterDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TypeParameterDeclarationSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_60;
  size_t index_local;
  TypeParameterDeclarationSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->super_ParameterDeclarationBaseSyntax).keyword.kind;
    token._2_1_ = (this->super_ParameterDeclarationBaseSyntax).keyword.field_0x2;
    token.numFlags.raw = (this->super_ParameterDeclarationBaseSyntax).keyword.numFlags.raw;
    token.rawLen = (this->super_ParameterDeclarationBaseSyntax).keyword.rawLen;
    token.info = (this->super_ParameterDeclarationBaseSyntax).keyword.info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->typeKeyword).kind;
    token_00._2_1_ = (this->typeKeyword).field_0x2;
    token_00.numFlags.raw = (this->typeKeyword).numFlags.raw;
    token_00.rawLen = (this->typeKeyword).rawLen;
    token_00.info = (this->typeKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (TypeParameterDeclarationSyntax *)0xffffffffffffffd0) {
      local_60 = &(this->declarators).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TypeParameterDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return keyword;
        case 1: return typeKeyword;
        case 2: return &declarators;
        default: return nullptr;
    }
}